

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::saveVectors(FastText *this)

{
  int iVar1;
  byte bVar2;
  int32_t iVar3;
  ostream *poVar4;
  element_type *peVar5;
  element_type *peVar6;
  void *this_00;
  string word;
  int32_t i;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mapOfSubWords;
  Vector subipa;
  Vector submorph;
  Vector sublemma;
  Vector subvec;
  Vector vec;
  ofstream ofi;
  ofstream ofmorph;
  ofstream oflemma;
  ofstream ofsub;
  ofstream ofs;
  int64_t in_stack_fffffffffffff408;
  Vector *in_stack_fffffffffffff410;
  Vector *v;
  ostream *in_stack_fffffffffffff420;
  int32_t id;
  Dictionary *in_stack_fffffffffffff428;
  char *in_stack_fffffffffffff430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff438;
  string *in_stack_fffffffffffff470;
  undefined7 in_stack_fffffffffffff478;
  FastText *in_stack_fffffffffffff480;
  string local_b60 [36];
  int local_b3c;
  string local_ab8 [32];
  Dictionary local_a98 [2];
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff718;
  Vector *in_stack_fffffffffffff720;
  Vector *in_stack_fffffffffffff728;
  Vector *in_stack_fffffffffffff730;
  Vector *in_stack_fffffffffffff738;
  FastText *in_stack_fffffffffffff740;
  int32_t *in_stack_fffffffffffff750;
  ofstream *in_stack_fffffffffffff758;
  ofstream *in_stack_fffffffffffff760;
  ofstream *in_stack_fffffffffffff768;
  ofstream *in_stack_fffffffffffff770;
  ostream local_878 [512];
  string local_678 [32];
  Vector local_658 [32];
  string local_458 [32];
  Vector local_438 [33];
  string local_228 [32];
  ostream local_208 [520];
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Saving Vectors");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x13800e);
  std::operator+(in_stack_fffffffffffff438,in_stack_fffffffffffff430);
  std::ofstream::ofstream(local_208,local_228,_S_out);
  std::__cxx11::string::~string(local_228);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x138067);
  std::operator+(in_stack_fffffffffffff438,in_stack_fffffffffffff430);
  std::ofstream::ofstream(local_438,local_458,_S_out);
  std::__cxx11::string::~string(local_458);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1380ba);
  std::operator+(in_stack_fffffffffffff438,in_stack_fffffffffffff430);
  std::ofstream::ofstream(local_658,local_678,_S_out);
  std::__cxx11::string::~string(local_678);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x13810d);
  std::operator+(in_stack_fffffffffffff438,in_stack_fffffffffffff430);
  std::ofstream::ofstream(local_878,(string *)&stack0xfffffffffffff768,_S_out);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff768);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x138163);
  std::operator+(in_stack_fffffffffffff438,in_stack_fffffffffffff430);
  std::ofstream::ofstream(local_a98,local_ab8,_S_out);
  std::__cxx11::string::~string(local_ab8);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Error opening file for saving vectors.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Error opening file for saving subword vectors.")
    ;
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  peVar5 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1383aa);
  iVar3 = Dictionary::nwords(peVar5);
  poVar4 = (ostream *)std::ostream::operator<<(local_208,iVar3);
  poVar4 = std::operator<<(poVar4," ");
  peVar6 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1383f5);
  this_00 = (void *)std::ostream::operator<<(poVar4,peVar6->dim);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x13842c);
  Vector::Vector(in_stack_fffffffffffff410,in_stack_fffffffffffff408);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x13844f);
  Vector::Vector(in_stack_fffffffffffff410,in_stack_fffffffffffff408);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x138472);
  Vector::Vector(in_stack_fffffffffffff410,in_stack_fffffffffffff408);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x138495);
  Vector::Vector(in_stack_fffffffffffff410,in_stack_fffffffffffff408);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1384b8);
  Vector::Vector(in_stack_fffffffffffff410,in_stack_fffffffffffff408);
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x1384db);
  local_b3c = 0;
  while( true ) {
    iVar1 = local_b3c;
    id = (int32_t)((ulong)in_stack_fffffffffffff420 >> 0x20);
    peVar5 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x138502);
    iVar3 = Dictionary::nwords(peVar5);
    if (iVar3 <= iVar1) break;
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x138531);
    Dictionary::getWord_abi_cxx11_(in_stack_fffffffffffff428,id);
    getVector(in_stack_fffffffffffff480,(Vector *)CONCAT17(bVar2,in_stack_fffffffffffff478),
              in_stack_fffffffffffff470);
    in_stack_fffffffffffff428 = local_a98;
    in_stack_fffffffffffff420 = local_878;
    v = local_658;
    in_stack_fffffffffffff410 = local_438;
    getSubVector(in_stack_fffffffffffff740,in_stack_fffffffffffff738,in_stack_fffffffffffff730,
                 in_stack_fffffffffffff728,in_stack_fffffffffffff720,in_stack_fffffffffffff718,
                 in_stack_fffffffffffff750,in_stack_fffffffffffff758,in_stack_fffffffffffff760,
                 in_stack_fffffffffffff768,in_stack_fffffffffffff770);
    poVar4 = std::operator<<(local_208,local_b60);
    std::operator<<(poVar4," ");
    poVar4 = operator<<(in_stack_fffffffffffff420,v);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_b60);
    local_b3c = local_b3c + 1;
  }
  std::ofstream::close();
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x138720);
  Vector::~Vector(in_stack_fffffffffffff410);
  Vector::~Vector(in_stack_fffffffffffff410);
  Vector::~Vector(in_stack_fffffffffffff410);
  Vector::~Vector(in_stack_fffffffffffff410);
  Vector::~Vector(in_stack_fffffffffffff410);
  std::ofstream::~ofstream(local_a98);
  std::ofstream::~ofstream(local_878);
  std::ofstream::~ofstream(local_658);
  std::ofstream::~ofstream(local_438);
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void FastText::saveVectors() {
  std::cout << "Saving Vectors" << std::endl;
  std::ofstream ofs(args_->output + ".vec");
  std::ofstream ofsub(args_->suboutput + ".vec");
  std::ofstream oflemma(args_->lemmaoutput + ".vec");
  std::ofstream ofmorph(args_->morphoutput + ".vec");
  std::ofstream ofi(args_->ipaoutput + ".vec");
  if (!ofs.is_open()) {
    std::cout << "Error opening file for saving vectors." << std::endl;
    exit(EXIT_FAILURE);
  }
  if (!ofsub.is_open()) {
    std::cout << "Error opening file for saving subword vectors." << std::endl;
    exit(EXIT_FAILURE);
  }
  ofs << dict_->nwords() << " " << args_->dim << std::endl;
  Vector vec(args_->dim);
  Vector subvec(args_->dim);
  Vector sublemma(args_->dim);
  Vector submorph(args_->dim);
  Vector subipa(args_->dim);
  std::map<int32_t,std::string> mapOfSubWords;
 
  for (int32_t i = 0; i < dict_->nwords(); i++) {
    std::string word = dict_->getWord(i);
   //std::cout << i << std::endl; 
   getVector(vec, word);
   getSubVector(subvec,sublemma,submorph,subipa, mapOfSubWords,i,ofsub,oflemma,ofmorph,ofi);
    ofs << word << " " << vec << std::endl;
  }
  ofs.close();
}